

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O1

void __thiscall Ptex::v2_4::PtexReader::TiledFaceBase::~TiledFaceBase(TiledFaceBase *this)

{
  pointer ppFVar1;
  
  (this->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
       (_func_int **)&PTR__TiledFaceBase_0011d698;
  ppFVar1 = (this->_tiles).
            super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppFVar1 !=
      (this->_tiles).
      super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (*ppFVar1 != (FaceData *)0x0) {
        (*((*ppFVar1)->super_PtexFaceData)._vptr_PtexFaceData[1])();
      }
      ppFVar1 = ppFVar1 + 1;
    } while (ppFVar1 !=
             (this->_tiles).
             super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppFVar1 = (this->_tiles).
            super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppFVar1 != (pointer)0x0) {
    operator_delete(ppFVar1,(long)(this->_tiles).
                                  super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar1
                   );
    return;
  }
  return;
}

Assistant:

virtual ~TiledFaceBase() {
            for (std::vector<FaceData*>::iterator i = _tiles.begin(); i != _tiles.end(); ++i) {
                if (*i) delete *i;
            }
        }